

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rbuObjIterCacheTableInfo(sqlite3rbu *p,RbuObjIter *pIter)

{
  undefined4 uVar1;
  sqlite3 *psVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  u8 *puVar6;
  u8 **ppuVar7;
  char *pcVar8;
  uchar *puVar9;
  bool bVar10;
  bool local_a2;
  bool local_8a;
  char *t_1;
  int t;
  char *zType;
  int bNotNull;
  int iPk;
  char *zName_1;
  char *zCopy;
  char *zName;
  int local_38;
  int iTnum;
  int iOrder;
  int bRbuRowid;
  int i;
  int nCol;
  sqlite3_stmt *pStmt;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  pIter_local = (RbuObjIter *)p;
  if (pIter->azTblCol == (char **)0x0) {
    _i = (sqlite3_stmt *)0x0;
    bRbuRowid = 0;
    iTnum = 0;
    local_38 = 0;
    zName._4_4_ = 0;
    pStmt = (sqlite3_stmt *)pIter;
    rbuTableType(p,pIter->zTbl,&pIter->eType,(int *)((long)&zName + 4),&pIter->iPkTnum);
    if ((*(int *)&pIter_local->abNotNull == 0) && (*(int *)(pStmt + 0x48) == 0)) {
      *(undefined4 *)&pIter_local->abNotNull = 1;
      puVar6 = (u8 *)sqlite3_mprintf("no such table: %s",*(undefined8 *)(pStmt + 0x50));
      pIter_local->abIndexed = puVar6;
    }
    if (*(int *)&pIter_local->abNotNull != 0) {
      return *(int *)&pIter_local->abNotNull;
    }
    if (*(long *)(pStmt + 0x60) == 0) {
      *(undefined4 *)(pStmt + 0x68) = zName._4_4_;
    }
    psVar2 = *(sqlite3 **)&pIter_local->nTblCol;
    ppuVar7 = &pIter_local->abIndexed;
    pcVar8 = sqlite3_mprintf("SELECT * FROM \'%q\'",*(undefined8 *)(pStmt + 0x58));
    iVar4 = prepareFreeAndCollectError(psVar2,(sqlite3_stmt **)&i,(char **)ppuVar7,pcVar8);
    *(int *)&pIter_local->abNotNull = iVar4;
    if (*(int *)&pIter_local->abNotNull == 0) {
      bRbuRowid = sqlite3_column_count(_i);
      rbuAllocateIterArrays((sqlite3rbu *)pIter_local,(RbuObjIter *)pStmt,bRbuRowid);
    }
    for (iOrder = 0; *(int *)&pIter_local->abNotNull == 0 && iOrder < bRbuRowid; iOrder = iOrder + 1
        ) {
      pcVar8 = sqlite3_column_name(_i,iOrder);
      iVar4 = sqlite3_strnicmp("rbu_",pcVar8,4);
      if (iVar4 == 0) {
        iVar4 = sqlite3_stricmp("rbu_rowid",pcVar8);
        if (iVar4 == 0) {
          iTnum = 1;
        }
      }
      else {
        pcVar8 = rbuStrndup(pcVar8,(int *)&pIter_local->abNotNull);
        *(undefined4 *)(*(long *)(pStmt + 0x28) + (long)*(int *)(pStmt + 0x10) * 4) =
             *(undefined4 *)(pStmt + 0x10);
        iVar4 = *(int *)(pStmt + 0x10);
        *(int *)(pStmt + 0x10) = iVar4 + 1;
        *(char **)(*(long *)(pStmt + 0x18) + (long)iVar4 * 8) = pcVar8;
      }
    }
    sqlite3_finalize(_i);
    _i = (sqlite3_stmt *)0x0;
    if ((*(int *)&pIter_local->abNotNull == 0) && (pIter_local->azTblCol != (char **)0x0)) {
      local_8a = true;
      if (*(int *)(pStmt + 0x48) != 5) {
        local_8a = *(int *)(pStmt + 0x48) == 1;
      }
      if (iTnum != (uint)local_8a) {
        *(undefined4 *)&pIter_local->abNotNull = 1;
        pcVar8 = "requires";
        if (iTnum != 0) {
          pcVar8 = "may not have";
        }
        puVar6 = (u8 *)sqlite3_mprintf("table %q %s rbu_rowid column",*(undefined8 *)(pStmt + 0x58),
                                       pcVar8);
        pIter_local->abIndexed = puVar6;
      }
    }
    if (*(int *)&pIter_local->abNotNull == 0) {
      psVar2 = (sqlite3 *)pIter_local->pIdxIter;
      ppuVar7 = &pIter_local->abIndexed;
      pcVar8 = sqlite3_mprintf("PRAGMA table_info(%Q)",*(undefined8 *)(pStmt + 0x50));
      iVar4 = prepareFreeAndCollectError(psVar2,(sqlite3_stmt **)&i,(char **)ppuVar7,pcVar8);
      *(int *)&pIter_local->abNotNull = iVar4;
    }
    while( true ) {
      bVar10 = false;
      if (*(int *)&pIter_local->abNotNull == 0) {
        iVar4 = sqlite3_step(_i);
        bVar10 = iVar4 == 100;
      }
      if ((!bVar10) || (puVar9 = sqlite3_column_text(_i,1), puVar9 == (uchar *)0x0)) break;
      iOrder = local_38;
      while ((iOrder < *(int *)(pStmt + 0x10) &&
             (iVar4 = strcmp((char *)puVar9,*(char **)(*(long *)(pStmt + 0x18) + (long)iOrder * 8)),
             iVar4 != 0))) {
        iOrder = iOrder + 1;
      }
      if (iOrder == *(int *)(pStmt + 0x10)) {
        *(undefined4 *)&pIter_local->abNotNull = 1;
        puVar6 = (u8 *)sqlite3_mprintf("column missing from %q: %s",*(undefined8 *)(pStmt + 0x58),
                                       puVar9);
        pIter_local->abIndexed = puVar6;
      }
      else {
        iVar4 = sqlite3_column_int(_i,5);
        uVar5 = sqlite3_column_int(_i,3);
        puVar9 = sqlite3_column_text(_i,2);
        if (iOrder != local_38) {
          uVar1 = *(undefined4 *)(*(long *)(pStmt + 0x28) + (long)iOrder * 4);
          *(undefined4 *)(*(long *)(pStmt + 0x28) + (long)iOrder * 4) =
               *(undefined4 *)(*(long *)(pStmt + 0x28) + (long)local_38 * 4);
          *(undefined4 *)(*(long *)(pStmt + 0x28) + (long)local_38 * 4) = uVar1;
          uVar3 = *(undefined8 *)(*(long *)(pStmt + 0x18) + (long)iOrder * 8);
          *(undefined8 *)(*(long *)(pStmt + 0x18) + (long)iOrder * 8) =
               *(undefined8 *)(*(long *)(pStmt + 0x18) + (long)local_38 * 8);
          *(undefined8 *)(*(long *)(pStmt + 0x18) + (long)local_38 * 8) = uVar3;
        }
        pcVar8 = rbuStrndup((char *)puVar9,(int *)&pIter_local->abNotNull);
        *(char **)(*(long *)(pStmt + 0x20) + (long)local_38 * 8) = pcVar8;
        *(bool *)(*(long *)(pStmt + 0x30) + (long)local_38) = iVar4 != 0;
        local_a2 = (uVar5 & 0xff) != 0 || iVar4 != 0;
        *(bool *)(*(long *)(pStmt + 0x38) + (long)local_38) = local_a2;
        local_38 = local_38 + 1;
      }
    }
    rbuFinalize((sqlite3rbu *)pIter_local,_i);
    rbuObjIterCacheIndexedCols((sqlite3rbu *)pIter_local,(RbuObjIter *)pStmt);
  }
  return *(int *)&pIter_local->abNotNull;
}

Assistant:

static int rbuObjIterCacheTableInfo(sqlite3rbu *p, RbuObjIter *pIter){
  if( pIter->azTblCol==0 ){
    sqlite3_stmt *pStmt = 0;
    int nCol = 0;
    int i;                        /* for() loop iterator variable */
    int bRbuRowid = 0;            /* If input table has column "rbu_rowid" */
    int iOrder = 0;
    int iTnum = 0;

    /* Figure out the type of table this step will deal with. */
    assert( pIter->eType==0 );
    rbuTableType(p, pIter->zTbl, &pIter->eType, &iTnum, &pIter->iPkTnum);
    if( p->rc==SQLITE_OK && pIter->eType==RBU_PK_NOTABLE ){
      p->rc = SQLITE_ERROR;
      p->zErrmsg = sqlite3_mprintf("no such table: %s", pIter->zTbl);
    }
    if( p->rc ) return p->rc;
    if( pIter->zIdx==0 ) pIter->iTnum = iTnum;

    assert( pIter->eType==RBU_PK_NONE || pIter->eType==RBU_PK_IPK 
         || pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_WITHOUT_ROWID
         || pIter->eType==RBU_PK_VTAB
    );

    /* Populate the azTblCol[] and nTblCol variables based on the columns
    ** of the input table. Ignore any input table columns that begin with
    ** "rbu_".  */
    p->rc = prepareFreeAndCollectError(p->dbRbu, &pStmt, &p->zErrmsg, 
        sqlite3_mprintf("SELECT * FROM '%q'", pIter->zDataTbl)
    );
    if( p->rc==SQLITE_OK ){
      nCol = sqlite3_column_count(pStmt);
      rbuAllocateIterArrays(p, pIter, nCol);
    }
    for(i=0; p->rc==SQLITE_OK && i<nCol; i++){
      const char *zName = (const char*)sqlite3_column_name(pStmt, i);
      if( sqlite3_strnicmp("rbu_", zName, 4) ){
        char *zCopy = rbuStrndup(zName, &p->rc);
        pIter->aiSrcOrder[pIter->nTblCol] = pIter->nTblCol;
        pIter->azTblCol[pIter->nTblCol++] = zCopy;
      }
      else if( 0==sqlite3_stricmp("rbu_rowid", zName) ){
        bRbuRowid = 1;
      }
    }
    sqlite3_finalize(pStmt);
    pStmt = 0;

    if( p->rc==SQLITE_OK
     && rbuIsVacuum(p)==0
     && bRbuRowid!=(pIter->eType==RBU_PK_VTAB || pIter->eType==RBU_PK_NONE)
    ){
      p->rc = SQLITE_ERROR;
      p->zErrmsg = sqlite3_mprintf(
          "table %q %s rbu_rowid column", pIter->zDataTbl,
          (bRbuRowid ? "may not have" : "requires")
      );
    }

    /* Check that all non-HIDDEN columns in the destination table are also
    ** present in the input table. Populate the abTblPk[], azTblType[] and
    ** aiTblOrder[] arrays at the same time.  */
    if( p->rc==SQLITE_OK ){
      p->rc = prepareFreeAndCollectError(p->dbMain, &pStmt, &p->zErrmsg, 
          sqlite3_mprintf("PRAGMA table_info(%Q)", pIter->zTbl)
      );
    }
    while( p->rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pStmt) ){
      const char *zName = (const char*)sqlite3_column_text(pStmt, 1);
      if( zName==0 ) break;  /* An OOM - finalize() below returns S_NOMEM */
      for(i=iOrder; i<pIter->nTblCol; i++){
        if( 0==strcmp(zName, pIter->azTblCol[i]) ) break;
      }
      if( i==pIter->nTblCol ){
        p->rc = SQLITE_ERROR;
        p->zErrmsg = sqlite3_mprintf("column missing from %q: %s",
            pIter->zDataTbl, zName
        );
      }else{
        int iPk = sqlite3_column_int(pStmt, 5);
        int bNotNull = sqlite3_column_int(pStmt, 3);
        const char *zType = (const char*)sqlite3_column_text(pStmt, 2);

        if( i!=iOrder ){
          SWAP(int, pIter->aiSrcOrder[i], pIter->aiSrcOrder[iOrder]);
          SWAP(char*, pIter->azTblCol[i], pIter->azTblCol[iOrder]);
        }

        pIter->azTblType[iOrder] = rbuStrndup(zType, &p->rc);
        pIter->abTblPk[iOrder] = (iPk!=0);
        pIter->abNotNull[iOrder] = (u8)bNotNull || (iPk!=0);
        iOrder++;
      }
    }

    rbuFinalize(p, pStmt);
    rbuObjIterCacheIndexedCols(p, pIter);
    assert( pIter->eType!=RBU_PK_VTAB || pIter->abIndexed==0 );
    assert( pIter->eType!=RBU_PK_VTAB || pIter->nIndex==0 );
  }

  return p->rc;
}